

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

void protect_up(refs_table_t *tbl,uint64_t a)

{
  uint64_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  uint64_t *puVar5;
  ulong uVar6;
  long lVar7;
  ulong *puVar8;
  ulong uVar9;
  uint64_t *puVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  refs_table_t *tbl_00;
  size_t sVar14;
  bool bVar15;
  bool bVar16;
  
  do {
    while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
      do {
        iVar11 = protect_resize_help(tbl);
      } while (iVar11 != 0);
    }
    LOCK();
    bVar15 = uVar2 == tbl->refs_control;
    if (bVar15) {
      tbl->refs_control = uVar2 + 1;
    }
    UNLOCK();
  } while (!bVar15);
  uVar9 = ((a >> 0x27 | a << 0x19) ^ (a ^ 0xcbf29ce484222325) * 0x100000001b3) * 0x100000001b3;
LAB_0012ba7b:
  do {
    puVar5 = tbl->refs_table + (tbl->refs_size - 1 & (uVar9 >> 0x20 ^ uVar9));
    iVar11 = 0x7f;
    puVar10 = (uint64_t *)0x0;
    do {
      while (*puVar5 == 0) {
        if (puVar10 != (uint64_t *)0x0) {
          LOCK();
          uVar1 = *puVar10;
          if (uVar1 == 0x7fffffffffffffff) {
            *puVar10 = a;
          }
          UNLOCK();
          if (uVar1 == 0x7fffffffffffffff) {
            do {
              uVar3 = tbl->refs_control;
              LOCK();
              bVar15 = uVar3 == tbl->refs_control;
              if (bVar15) {
                tbl->refs_control = uVar3 - 1;
              }
              UNLOCK();
            } while (!bVar15);
            return;
          }
          goto LAB_0012ba7b;
        }
        LOCK();
        uVar1 = *puVar5;
        if (uVar1 == 0) {
          *puVar5 = a;
        }
        UNLOCK();
        if (uVar1 == 0) {
          do {
            uVar3 = tbl->refs_control;
            LOCK();
            bVar15 = uVar3 == tbl->refs_control;
            if (bVar15) {
              tbl->refs_control = uVar3 - 1;
            }
            UNLOCK();
          } while (!bVar15);
          return;
        }
      }
      if ((*puVar5 == 0x7fffffffffffffff) && (puVar10 == (uint64_t *)0x0)) {
        puVar10 = puVar5;
      }
      puVar5 = puVar5 + 1;
      if (puVar5 == tbl->refs_table + tbl->refs_size) {
        puVar5 = tbl->refs_table;
      }
      bVar15 = iVar11 != 0;
      iVar11 = iVar11 + -1;
    } while (bVar15);
    if (puVar10 == (uint64_t *)0x0) {
      do {
        uVar3 = tbl->refs_control;
        LOCK();
        bVar15 = uVar3 == tbl->refs_control;
        if (bVar15) {
          tbl->refs_control = uVar3 - 1;
        }
        UNLOCK();
      } while (!bVar15);
      do {
        uVar2 = tbl->refs_control;
        if (uVar2 < 0x10000000) {
          bVar15 = false;
          LOCK();
          bVar16 = uVar2 == tbl->refs_control;
          if (bVar16) {
            tbl->refs_control = uVar2 | 0x80000000;
          }
          UNLOCK();
          if (bVar16) {
            do {
            } while( true );
          }
        }
        else {
          do {
            iVar11 = protect_resize_help(tbl);
          } while (iVar11 != 0);
          bVar15 = true;
        }
      } while (!bVar15);
      if (!bVar15) {
        tbl->refs_resize_table = tbl->refs_table;
        tbl->refs_resize_size = tbl->refs_size;
        LOCK();
        tbl->refs_resize_part = 0;
        UNLOCK();
        LOCK();
        tbl->refs_resize_done = 0;
        UNLOCK();
        uVar12 = tbl->refs_size;
        uVar6 = 0;
        if (uVar12 != 0) {
          lVar13 = 0;
          lVar7 = 0;
          do {
            lVar4 = *(long *)((long)tbl->refs_table + lVar13);
            if ((lVar4 != 0) && (lVar4 != 0x7fffffffffffffff)) {
              lVar7 = lVar7 + 1;
            }
            lVar13 = lVar13 + 8;
          } while (uVar12 * 8 - lVar13 != 0);
          uVar6 = lVar7 << 2;
        }
        sVar14 = uVar12 << (uVar12 < uVar6);
        uVar12 = sVar14 * 8 + 0x3f & 0xffffffffffffffc0;
        tbl_00 = (refs_table_t *)0x0;
        puVar5 = (uint64_t *)mmap((void *)0x0,uVar12,3,0x22,-1,0);
        if ((long)puVar5 + 1U < 2) {
          protect_up_cold_1();
          do {
            while (uVar2 = tbl_00->refs_control, 0xfffffff < uVar2) {
              do {
                iVar11 = protect_resize_help(tbl_00);
              } while (iVar11 != 0);
            }
            LOCK();
            bVar15 = uVar2 == tbl_00->refs_control;
            if (bVar15) {
              tbl_00->refs_control = uVar2 + 1;
            }
            UNLOCK();
          } while (!bVar15);
          uVar9 = ((uVar12 >> 0x27 | uVar12 << 0x19) ^ (uVar12 ^ 0xcbf29ce484222325) * 0x100000001b3
                  ) * 0x100000001b3;
          puVar8 = tbl_00->refs_table + (tbl_00->refs_size - 1 & (uVar9 >> 0x20 ^ uVar9));
          iVar11 = 0x80;
          do {
            bVar15 = iVar11 == 0;
            iVar11 = iVar11 + -1;
            if (bVar15) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_refs.c"
                            ,0x21c,"void protect_down(refs_table_t *, uint64_t)");
            }
            uVar9 = *puVar8;
            if (uVar9 == uVar12) {
              *puVar8 = 0x7fffffffffffffff;
              do {
                uVar3 = tbl_00->refs_control;
                LOCK();
                bVar15 = uVar3 == tbl_00->refs_control;
                if (bVar15) {
                  tbl_00->refs_control = uVar3 - 1;
                }
                UNLOCK();
              } while (!bVar15);
            }
            else {
              puVar8 = puVar8 + 1;
              if (puVar8 == tbl_00->refs_table + tbl_00->refs_size) {
                puVar8 = tbl_00->refs_table;
              }
            }
          } while (uVar9 != uVar12);
          return;
        }
        tbl->refs_table = puVar5;
        tbl->refs_size = sVar14;
        LOCK();
        tbl->refs_control = 0x40000000;
        UNLOCK();
        while (tbl->refs_resize_done < tbl->refs_resize_size >> 7) {
          protect_resize_help(tbl);
        }
        LOCK();
        tbl->refs_control = 0;
        UNLOCK();
        munmap(tbl->refs_resize_table,tbl->refs_resize_size * 8 + 0x3f & 0xffffffffffffffc0);
      }
      do {
        while (uVar2 = tbl->refs_control, 0xfffffff < uVar2) {
          do {
            iVar11 = protect_resize_help(tbl);
          } while (iVar11 != 0);
        }
        LOCK();
        bVar15 = uVar2 == tbl->refs_control;
        if (bVar15) {
          tbl->refs_control = uVar2 + 1;
        }
        UNLOCK();
      } while (!bVar15);
    }
    else {
      LOCK();
      uVar1 = *puVar10;
      if (uVar1 == 0x7fffffffffffffff) {
        *puVar10 = a;
      }
      UNLOCK();
      if (uVar1 == 0x7fffffffffffffff) {
        do {
          uVar3 = tbl->refs_control;
          LOCK();
          bVar15 = uVar3 == tbl->refs_control;
          if (bVar15) {
            tbl->refs_control = uVar3 - 1;
          }
          UNLOCK();
        } while (!bVar15);
        return;
      }
    }
  } while( true );
}

Assistant:

void
protect_up(refs_table_t *tbl, uint64_t a)
{
    _Atomic(uint64_t)* bucket;
    _Atomic(uint64_t)* ts_bucket;
    uint64_t v;
    int i;

    protect_enter(tbl);

ref_retry:
    bucket = tbl->refs_table + (fnvhash8(a) & (tbl->refs_size - 1));
    ts_bucket = NULL; // tombstone
    i = 128; // try 128 times linear probing

    while (i--) {
ref_restart:
        v = *bucket;
        if (v == refs_ts) {
            if (ts_bucket == NULL) ts_bucket = bucket;
        } else if (v == 0) {
            // go go go
            if (ts_bucket != NULL) {
                v = refs_ts;
                if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_retry;
                }
            } else {
                if (atomic_compare_exchange_weak(bucket, &v, a)) {
                    protect_leave(tbl);
                    return;
                } else {
                    goto ref_restart;
                }
            }
        }

        if (++bucket == tbl->refs_table + tbl->refs_size) bucket = tbl->refs_table;
    }

    // not found after linear probing
    if (ts_bucket != NULL) {
        v = refs_ts;
        if (atomic_compare_exchange_weak(ts_bucket, &v, a)) {
            protect_leave(tbl);
            return;
        } else {
            goto ref_retry;
        }
    } else {
        // hash table full
        protect_leave(tbl);
        protect_resize(tbl);
        protect_enter(tbl);
        goto ref_retry;
    }
}